

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::PropertyIdOnRegSlotsContainer::CreateRegSlotsArray
          (PropertyIdOnRegSlotsContainer *this,Recycler *recycler,uint _length)

{
  code *pcVar1;
  bool bVar2;
  int **ppiVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  int *ptr;
  TrackAllocData local_48;
  uint local_1c;
  Recycler *pRStack_18;
  uint _length_local;
  Recycler *recycler_local;
  PropertyIdOnRegSlotsContainer *this_local;
  
  local_1c = _length;
  pRStack_18 = recycler;
  recycler_local = (Recycler *)this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  if (*ppiVar3 != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x15fe,"(propertyIdsForRegSlots == nullptr)",
                                "propertyIdsForRegSlots == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = pRStack_18;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&int::typeinfo,0,(ulong)local_1c,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x15ff);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                  ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)local_1c);
  Memory::WriteBarrierPtr<int>::operator=(&this->propertyIdsForRegSlots,ptr);
  this->length = local_1c;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::CreateRegSlotsArray(Recycler * recycler, uint _length)
    {
        Assert(propertyIdsForRegSlots == nullptr);
        propertyIdsForRegSlots = RecyclerNewArrayLeafZ(recycler, PropertyId, _length);
        length = _length;
    }